

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_entityrelationtask.cc
# Opt level: O0

void EntityRelationTask::initialize(search *sch,size_t *param_2,options_i *options)

{
  typed_option<float> *op;
  typed_option<float> *this;
  example *new_ele;
  undefined8 *in_RDX;
  search *in_RDI;
  size_t a;
  wclass default_wclass;
  example *ldf_examples;
  int i_1;
  int i;
  option_group_definition new_options;
  task_data *my_task_data;
  typed_option<float> *in_stack_fffffffffffff4b8;
  typed_option<float> *in_stack_fffffffffffff4c0;
  string *in_stack_fffffffffffff4c8;
  allocator *paVar1;
  typed_option<float> *in_stack_fffffffffffff4d0;
  typed_option<float> *in_stack_fffffffffffff508;
  option_group_definition *in_stack_fffffffffffff510;
  option_group_definition *this_00;
  ulong local_a20;
  undefined1 local_a18 [16];
  example *local_a08;
  int local_9fc;
  int local_9f8;
  int local_9f4;
  int local_9f0;
  allocator local_9e9;
  string local_9e8 [39];
  allocator local_9c1;
  string local_9c0 [76];
  uint32_t in_stack_fffffffffffff68c;
  search *in_stack_fffffffffffff690;
  allocator local_859;
  string local_858 [39];
  undefined1 local_831 [33];
  typed_option<float> local_810 [2];
  allocator local_6c9;
  string local_6c8 [39];
  allocator local_6a1;
  string local_6a0 [32];
  typed_option<float> local_680 [2];
  allocator local_539;
  string local_538 [39];
  allocator local_511;
  string local_510 [32];
  typed_option<bool> local_4f0 [2];
  allocator local_3a9;
  string local_3a8 [39];
  allocator local_381;
  string local_380 [32];
  typed_option<float> local_360 [2];
  allocator local_219;
  string local_218 [39];
  allocator local_1f1;
  string local_1f0 [32];
  typed_option<float> local_1d0 [2];
  allocator local_79;
  string local_78 [32];
  undefined1 local_58 [56];
  task_data *local_20;
  undefined8 *local_18;
  search *local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  local_20 = (task_data *)operator_new(0x70);
  local_20->ldf_entity = (example *)0x0;
  local_20->ldf_relation = (example *)0x0;
  (local_20->y_allowed_relation).erase_count = 0;
  local_20->search_order = 0;
  (local_20->y_allowed_relation)._end = (uint *)0x0;
  (local_20->y_allowed_relation).end_array = (uint *)0x0;
  (local_20->y_allowed_entity).erase_count = 0;
  (local_20->y_allowed_relation)._begin = (uint *)0x0;
  (local_20->y_allowed_entity)._end = (uint *)0x0;
  (local_20->y_allowed_entity).end_array = (uint *)0x0;
  local_20->constraints = false;
  local_20->allow_skip = false;
  *(undefined6 *)&local_20->field_0x12 = 0;
  (local_20->y_allowed_entity)._begin = (uint *)0x0;
  local_20->relation_none_cost = 0.0;
  local_20->entity_cost = 0.0;
  local_20->relation_cost = 0.0;
  local_20->skip_cost = 0.0;
  Search::search::set_task_data<EntityRelationTask::task_data>(local_8,local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"Entity Relation Options",&local_79);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff4c0,
             (string *)in_stack_fffffffffffff4b8);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f0,"relation_cost",&local_1f1);
  VW::config::make_option<float>(in_stack_fffffffffffff4c8,(float *)in_stack_fffffffffffff4c0);
  VW::config::typed_option<float>::keep(local_1d0,true);
  VW::config::typed_option<float>::default_value
            (in_stack_fffffffffffff4d0,(float)((ulong)in_stack_fffffffffffff4c8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_218,"Relation Cost",&local_219);
  VW::config::typed_option<float>::help
            (in_stack_fffffffffffff4c0,(string *)in_stack_fffffffffffff4b8);
  VW::config::typed_option<float>::typed_option(in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8)
  ;
  VW::config::option_group_definition::add<float>
            (in_stack_fffffffffffff510,in_stack_fffffffffffff508);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_380,"entity_cost",&local_381);
  VW::config::make_option<float>(in_stack_fffffffffffff4c8,(float *)in_stack_fffffffffffff4c0);
  VW::config::typed_option<float>::keep(local_360,true);
  VW::config::typed_option<float>::default_value
            (in_stack_fffffffffffff4d0,(float)((ulong)in_stack_fffffffffffff4c8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3a8,"Entity Cost",&local_3a9);
  VW::config::typed_option<float>::help
            (in_stack_fffffffffffff4c0,(string *)in_stack_fffffffffffff4b8);
  VW::config::typed_option<float>::typed_option(in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8)
  ;
  VW::config::option_group_definition::add<float>
            (in_stack_fffffffffffff510,in_stack_fffffffffffff508);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_510,"constraints",&local_511);
  VW::config::make_option<bool>(in_stack_fffffffffffff4c8,(bool *)in_stack_fffffffffffff4c0);
  VW::config::typed_option<bool>::keep(local_4f0,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_538,"Use Constraints",&local_539);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff4c0,(string *)in_stack_fffffffffffff4b8);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_fffffffffffff4c0,
             (typed_option<bool> *)in_stack_fffffffffffff4b8);
  VW::config::option_group_definition::add<bool>
            (in_stack_fffffffffffff510,(typed_option<bool> *)in_stack_fffffffffffff508);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6a0,"relation_none_cost",&local_6a1);
  VW::config::make_option<float>(in_stack_fffffffffffff4c8,(float *)in_stack_fffffffffffff4c0);
  VW::config::typed_option<float>::keep(local_680,true);
  VW::config::typed_option<float>::default_value
            (in_stack_fffffffffffff4d0,(float)((ulong)in_stack_fffffffffffff4c8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6c8,"None Relation Cost",&local_6c9);
  VW::config::typed_option<float>::help
            (in_stack_fffffffffffff4c0,(string *)in_stack_fffffffffffff4b8);
  VW::config::typed_option<float>::typed_option(in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8)
  ;
  VW::config::option_group_definition::add<float>
            (in_stack_fffffffffffff510,in_stack_fffffffffffff508);
  this_00 = (option_group_definition *)local_831;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_831 + 1),"skip_cost",(allocator *)this_00);
  VW::config::make_option<float>(in_stack_fffffffffffff4c8,(float *)in_stack_fffffffffffff4c0);
  op = VW::config::typed_option<float>::keep(local_810,true);
  VW::config::typed_option<float>::default_value
            (in_stack_fffffffffffff4d0,(float)((ulong)in_stack_fffffffffffff4c8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_858,"Skip Cost (only used when search_order = skip",&local_859)
  ;
  VW::config::typed_option<float>::help
            (in_stack_fffffffffffff4c0,(string *)in_stack_fffffffffffff4b8);
  VW::config::typed_option<float>::typed_option(in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8)
  ;
  VW::config::option_group_definition::add<float>(this_00,op);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9c0,"search_order",&local_9c1);
  VW::config::make_option<unsigned_long>
            (in_stack_fffffffffffff4c8,(unsigned_long *)in_stack_fffffffffffff4c0);
  VW::config::typed_option<unsigned_long>::keep
            ((typed_option<unsigned_long> *)(local_9c0 + 0x20),true);
  VW::config::typed_option<unsigned_long>::default_value
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff4d0,
             (unsigned_long)in_stack_fffffffffffff4c8);
  paVar1 = &local_9e9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_9e8,"Search Order 0: EntityFirst 1: Mix 2: Skip 3: EntityFirst(LDF)",paVar1);
  this = (typed_option<float> *)
         VW::config::typed_option<unsigned_long>::help
                   ((typed_option<unsigned_long> *)in_stack_fffffffffffff4c0,
                    (string *)in_stack_fffffffffffff4b8);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)this,
             (typed_option<unsigned_long> *)in_stack_fffffffffffff4b8);
  VW::config::option_group_definition::add<unsigned_long>(this_00,(typed_option<unsigned_long> *)op)
  ;
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)this);
  std::__cxx11::string::~string(local_9e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9e9);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)this);
  std::__cxx11::string::~string(local_9c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9c1);
  VW::config::typed_option<float>::~typed_option(this);
  std::__cxx11::string::~string(local_858);
  std::allocator<char>::~allocator((allocator<char> *)&local_859);
  VW::config::typed_option<float>::~typed_option(this);
  std::__cxx11::string::~string((string *)(local_831 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_831);
  VW::config::typed_option<float>::~typed_option(this);
  std::__cxx11::string::~string(local_6c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6c9);
  VW::config::typed_option<float>::~typed_option(this);
  std::__cxx11::string::~string(local_6a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6a1);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)this);
  std::__cxx11::string::~string(local_538);
  std::allocator<char>::~allocator((allocator<char> *)&local_539);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)this);
  std::__cxx11::string::~string(local_510);
  std::allocator<char>::~allocator((allocator<char> *)&local_511);
  VW::config::typed_option<float>::~typed_option(this);
  std::__cxx11::string::~string(local_3a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
  VW::config::typed_option<float>::~typed_option(this);
  std::__cxx11::string::~string(local_380);
  std::allocator<char>::~allocator((allocator<char> *)&local_381);
  VW::config::typed_option<float>::~typed_option(this);
  std::__cxx11::string::~string(local_218);
  std::allocator<char>::~allocator((allocator<char> *)&local_219);
  VW::config::typed_option<float>::~typed_option(this);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  (**(code **)*local_18)(local_18,local_58);
  for (local_9f0 = 1; local_9f0 < 5; local_9f0 = local_9f0 + 1) {
    local_9f4 = local_9f0;
    v_array<unsigned_int>::push_back
              ((v_array<unsigned_int> *)this,(uint *)in_stack_fffffffffffff4b8);
  }
  for (local_9f8 = 5; local_9f8 < 0xb; local_9f8 = local_9f8 + 1) {
    local_9fc = local_9f8;
    v_array<unsigned_int>::push_back
              ((v_array<unsigned_int> *)this,(uint *)in_stack_fffffffffffff4b8);
  }
  local_20->allow_skip = false;
  if ((local_20->search_order == 3) || (local_20->search_order == 4)) {
    new_ele = VW::alloc_examples((size_t)paVar1,(size_t)this);
    local_a08 = new_ele;
    memset(local_a18,0,0x10);
    for (local_a20 = 0; local_a20 < 10; local_a20 = local_a20 + 1) {
      v_array<COST_SENSITIVE::wclass>::push_back
                ((v_array<COST_SENSITIVE::wclass> *)this,(wclass *)new_ele);
    }
    local_20->ldf_entity = local_a08;
    local_20->ldf_relation = local_a08 + 4;
    Search::search::set_options(in_stack_fffffffffffff690,in_stack_fffffffffffff68c);
  }
  else {
    Search::search::set_options(in_stack_fffffffffffff690,in_stack_fffffffffffff68c);
  }
  Search::search::set_num_learners(local_8,2);
  if (local_20->search_order == 4) {
    Search::search::set_num_learners(local_8,3);
  }
  VW::config::option_group_definition::~option_group_definition((option_group_definition *)this);
  return;
}

Assistant:

void initialize(Search::search& sch, size_t& /*num_actions*/, options_i& options)
{
  task_data* my_task_data = new task_data();
  sch.set_task_data<task_data>(my_task_data);

  option_group_definition new_options("Entity Relation Options");
  new_options
      .add(make_option("relation_cost", my_task_data->relation_cost).keep().default_value(1.f).help("Relation Cost"))
      .add(make_option("entity_cost", my_task_data->entity_cost).keep().default_value(1.f).help("Entity Cost"))
      .add(make_option("constraints", my_task_data->constraints).keep().help("Use Constraints"))
      .add(make_option("relation_none_cost", my_task_data->relation_none_cost)
               .keep()
               .default_value(0.5f)
               .help("None Relation Cost"))
      .add(make_option("skip_cost", my_task_data->skip_cost)
               .keep()
               .default_value(0.01f)
               .help("Skip Cost (only used when search_order = skip"))
      .add(make_option("search_order", my_task_data->search_order)
               .keep()
               .default_value(0)
               .help("Search Order 0: EntityFirst 1: Mix 2: Skip 3: EntityFirst(LDF)"));
  options.add_and_parse(new_options);

  // setup entity and relation labels
  // Entity label 1:E_Other 2:E_Peop 3:E_Org 4:E_Loc
  // Relation label 5:R_Live_in 6:R_OrgBased_in 7:R_Located_in 8:R_Work_For 9:R_Kill 10:R_None
  for (int i = 1; i < 5; i++) my_task_data->y_allowed_entity.push_back(i);

  for (int i = 5; i < 11; i++) my_task_data->y_allowed_relation.push_back(i);

  my_task_data->allow_skip = false;

  if (my_task_data->search_order != 3 && my_task_data->search_order != 4)
  {
    sch.set_options(0);
  }
  else
  {
    example* ldf_examples = VW::alloc_examples(sizeof(CS::label), 10);
    CS::wclass default_wclass = {0., 0, 0., 0.};
    for (size_t a = 0; a < 10; a++)
    {
      ldf_examples[a].l.cs.costs.push_back(default_wclass);
    }
    my_task_data->ldf_entity = ldf_examples;
    my_task_data->ldf_relation = ldf_examples + 4;
    sch.set_options(Search::IS_LDF);
  }

  sch.set_num_learners(2);
  if (my_task_data->search_order == 4)
    sch.set_num_learners(3);
}